

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O0

ExtremeValues * __thiscall
bezier::Bezier<2UL>::derivativeZero2(ExtremeValues *__return_storage_ptr__,Bezier<2UL> *this)

{
  bool bVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  double *pdVar4;
  Vec2 VVar5;
  Vec2 local_80;
  Vec2 local_70;
  Vec2 local_60 [2];
  Vec2 local_40;
  undefined1 local_30 [8];
  Point roots;
  Bezier<2UL> *this_local;
  ExtremeValues *xVals;
  
  roots.y._7_1_ = 0;
  ExtremeValues::ExtremeValues(__return_storage_ptr__);
  pvVar2 = std::array<bezier::Vec2,_3UL>::operator[](&this->mControlPoints,0);
  pvVar3 = std::array<bezier::Vec2,_3UL>::operator[](&this->mControlPoints,1);
  local_40 = Vec2::operator-(pvVar2,pvVar3);
  pvVar2 = std::array<bezier::Vec2,_3UL>::operator[](&this->mControlPoints,0);
  pvVar3 = std::array<bezier::Vec2,_3UL>::operator[](&this->mControlPoints,1);
  local_80 = Vec2::operator*(pvVar3,2.0);
  local_70 = Vec2::operator-(pvVar2,&local_80);
  pvVar2 = std::array<bezier::Vec2,_3UL>::operator[](&this->mControlPoints,2);
  local_60[0] = Vec2::operator+(&local_70,pvVar2);
  VVar5 = Vec2::operator/(&local_40,local_60);
  roots.x = VVar5.y;
  local_30 = (undefined1  [8])VVar5.x;
  pdVar4 = Vec2::operator[]((Vec2 *)local_30,0);
  bVar1 = internal::isWithinZeroAndOne(*pdVar4);
  if (bVar1) {
    pdVar4 = Vec2::operator[]((Vec2 *)local_30,0);
    ExtremeValues::add(__return_storage_ptr__,*pdVar4,0);
  }
  pdVar4 = Vec2::operator[]((Vec2 *)local_30,1);
  bVar1 = internal::isWithinZeroAndOne(*pdVar4);
  if (bVar1) {
    pdVar4 = Vec2::operator[]((Vec2 *)local_30,1);
    ExtremeValues::add(__return_storage_ptr__,*pdVar4,1);
  }
  return __return_storage_ptr__;
}

Assistant:

ExtremeValues derivativeZero2() const
        {
            assert(N == 2);
            ExtremeValues xVals;
            Point roots = (mControlPoints[0] - mControlPoints[1]) / (mControlPoints[0] - mControlPoints[1] * 2 + mControlPoints[2]);
            if (internal::isWithinZeroAndOne(roots[0]))
                xVals.add(roots[0], 0);
            if (internal::isWithinZeroAndOne(roots[1]))
                xVals.add(roots[1], 1);
            return xVals;
        }